

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O1

TypeAndOffset * __thiscall
soul::SubElementPath::getElement
          (TypeAndOffset *__return_storage_ptr__,SubElementPath *this,Type *parentType)

{
  Category CVar1;
  size_t sVar2;
  bool bVar3;
  BoundedIntSize BVar4;
  bool bVar5;
  uint64_t uVar6;
  Structure *pSVar7;
  int line;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  long lVar10;
  ulong uVar11;
  char *local_50;
  Type local_48;
  
  CVar1 = parentType->arrayElementCategory;
  bVar5 = parentType->isRef;
  bVar3 = parentType->isConstant;
  (__return_storage_ptr__->type).category = parentType->category;
  (__return_storage_ptr__->type).arrayElementCategory = CVar1;
  (__return_storage_ptr__->type).isRef = bVar5;
  (__return_storage_ptr__->type).isConstant = bVar3;
  (__return_storage_ptr__->type).primitiveType.type = (parentType->primitiveType).type;
  BVar4 = parentType->arrayElementBoundingSize;
  (__return_storage_ptr__->type).boundingSize = parentType->boundingSize;
  (__return_storage_ptr__->type).arrayElementBoundingSize = BVar4;
  pSVar7 = (parentType->structure).object;
  (__return_storage_ptr__->type).structure.object = pSVar7;
  if (pSVar7 != (Structure *)0x0) {
    (pSVar7->super_RefCountedObject).refCount = (pSVar7->super_RefCountedObject).refCount + 1;
  }
  __return_storage_ptr__->offset = 0;
  sVar2 = (this->indexes).numActive;
  if (sVar2 != 0) {
    puVar9 = (this->indexes).items;
    puVar8 = puVar9 + sVar2;
    local_50 = "! e.type.isUnsizedArray()";
    do {
      CVar1 = (__return_storage_ptr__->type).category;
      if ((CVar1 & ~primitive) == vector) {
        if ((CVar1 == array) && ((__return_storage_ptr__->type).boundingSize == 0)) {
          line = 0x22e;
LAB_001a3b16:
          throwInternalCompilerError(local_50,"getElement",line);
        }
        bVar5 = Type::isValidArrayOrVectorIndex<unsigned_long>
                          (&__return_storage_ptr__->type,*puVar9);
        if (!bVar5) {
          line = 0x22f;
          local_50 = "e.type.isValidArrayOrVectorIndex (index)";
          goto LAB_001a3b16;
        }
        Type::getElementType(&local_48,&__return_storage_ptr__->type);
        (__return_storage_ptr__->type).category = local_48.category;
        (__return_storage_ptr__->type).arrayElementCategory = local_48.arrayElementCategory;
        (__return_storage_ptr__->type).isRef = local_48.isRef;
        (__return_storage_ptr__->type).isConstant = local_48.isConstant;
        (__return_storage_ptr__->type).primitiveType.type = local_48.primitiveType.type;
        (__return_storage_ptr__->type).boundingSize = local_48.boundingSize;
        (__return_storage_ptr__->type).arrayElementBoundingSize = local_48.arrayElementBoundingSize;
        pSVar7 = (__return_storage_ptr__->type).structure.object;
        if (local_48.structure.object != pSVar7) {
          (__return_storage_ptr__->type).structure.object = local_48.structure.object;
          local_48.structure.object = (Structure *)0x0;
          RefCountedPtr<soul::Structure>::decIfNotNull(pSVar7);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
        uVar6 = Type::getPackedSizeInBytes(&__return_storage_ptr__->type);
        __return_storage_ptr__->offset = __return_storage_ptr__->offset + uVar6 * *puVar9;
      }
      else {
        if (CVar1 != structure) {
          throwInternalCompilerError("getElement",0x242);
        }
        pSVar7 = Type::getStructRef(&__return_storage_ptr__->type);
        if ((pSVar7->members).numActive <= *puVar9) {
          throwInternalCompilerError("index < members.size()","getElement",0x239);
        }
        Type::operator=(&__return_storage_ptr__->type,&(pSVar7->members).items[*puVar9].type);
        if (*puVar9 != 0) {
          lVar10 = 0;
          uVar11 = 0;
          do {
            if ((pSVar7->members).numActive <= uVar11) {
              throwInternalCompilerError("index < numActive","operator[]",0x9e);
            }
            uVar6 = Type::getPackedSizeInBytes
                              ((Type *)(&(((pSVar7->members).items)->type).category + lVar10));
            __return_storage_ptr__->offset = __return_storage_ptr__->offset + uVar6;
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x40;
          } while (uVar11 < *puVar9);
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

SubElementPath::TypeAndOffset SubElementPath::getElement (const Type& parentType) const
{
    TypeAndOffset e { parentType, 0 };

    for (auto& index : indexes)
    {
        if (e.type.isArrayOrVector())
        {
            SOUL_ASSERT (! e.type.isUnsizedArray());
            SOUL_ASSERT (e.type.isValidArrayOrVectorIndex (index));

            e.type = e.type.getElementType();
            e.offset += ((size_t) e.type.getPackedSizeInBytes()) * index;
            continue;
        }

        if (e.type.isStruct())
        {
            auto& members = e.type.getStructRef().getMembers();
            SOUL_ASSERT (index < members.size());
            e.type = members[index].type;

            for (size_t i = 0; i < index; ++i)
                e.offset += (size_t) members[i].type.getPackedSizeInBytes();

            continue;
        }

        SOUL_ASSERT_FALSE;
    }

    return e;
}